

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O0

void Lms_GiaPrintSubgraph_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  if (((*(ulong *)pObj >> 0x1e & 1) != 0) && (iVar1 = Gia_ObjIsCi(pObj), iVar1 == 0)) {
    *(ulong *)pObj = *(ulong *)pObj & 0xffffffffbfffffff;
    iVar1 = Gia_ObjIsAnd(pObj);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                    ,0x114,"void Lms_GiaPrintSubgraph_rec(Gia_Man_t *, Gia_Obj_t *)");
    }
    pGVar2 = Gia_ObjFanin0(pObj);
    Lms_GiaPrintSubgraph_rec(p,pGVar2);
    pGVar2 = Gia_ObjFanin1(pObj);
    Lms_GiaPrintSubgraph_rec(p,pGVar2);
    Gia_ObjPrint(p,pObj);
  }
  return;
}

Assistant:

void Lms_GiaPrintSubgraph_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( !pObj->fMark0 || Gia_ObjIsCi(pObj) )
        return;
    pObj->fMark0 = 0;
    assert( Gia_ObjIsAnd(pObj) );
    Lms_GiaPrintSubgraph_rec( p, Gia_ObjFanin0(pObj) );
    Lms_GiaPrintSubgraph_rec( p, Gia_ObjFanin1(pObj) );
    Gia_ObjPrint( p, pObj );
}